

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
     ::resize_impl(Descriptor *common,
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                  *new_capacity)

{
  undefined8 this;
  bool bVar1;
  slot_type *psVar2;
  size_t sVar3;
  HeapOrSoo *pHVar4;
  allocator_type *paVar5;
  void *buf;
  size_t sVar6;
  ctrl_t *pcVar7;
  h2_t local_bf;
  byte local_be;
  allocator<char> local_bb [2];
  HashtablezInfoHandle local_b9;
  size_t local_b8;
  size_t i;
  size_t total_probe_length;
  slot_type *old_slots;
  anon_class_24_3_14f42436 insert_slot;
  slot_type *new_slots;
  allocator<char> local_6a;
  byte local_69;
  undefined1 auStack_68 [7];
  bool grow_single_group;
  MaybeInitializedPtr MStack_60;
  undefined1 local_50 [8];
  HashSetResizeHelper resize_helper;
  undefined1 auStack_28 [5];
  ctrl_t soo_slot_h2;
  bool had_soo_slot;
  bool was_soo;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
  *set;
  size_t new_capacity_local;
  CommonFields *common_local;
  
  _auStack_28 = common;
  set = new_capacity;
  new_capacity_local = (size_t)common;
  bVar1 = IsValidCapacity((size_t)new_capacity);
  if (!bVar1) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  bVar1 = fits_in_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                       *)_auStack_28,(size_t)set);
  if (!bVar1) {
    resize_helper._31_1_ =
         is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                 *)_auStack_28);
    local_be = 0;
    if ((bool)resize_helper._31_1_) {
      bVar1 = empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                     *)_auStack_28);
      local_be = bVar1 ^ 0xff;
    }
    this = _auStack_28;
    resize_helper._30_1_ = local_be & 1;
    if (resize_helper._30_1_ == 0) {
      local_bf = 0x80;
    }
    else {
      psVar2 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                         *)_auStack_28);
      sVar3 = hash_of((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                       *)this,psVar2);
      local_bf = H2(sVar3);
    }
    resize_helper._29_1_ = local_bf;
    HashSetResizeHelper::HashSetResizeHelper
              ((HashSetResizeHelper *)local_50,new_capacity_local,resize_helper._31_1_ & 1,
               resize_helper._30_1_ & 1);
    _auStack_68 = CommonFields::heap_or_soo((CommonFields *)new_capacity_local);
    pHVar4 = HashSetResizeHelper::old_heap_or_soo((HashSetResizeHelper *)local_50);
    (pHVar4->heap).control = _auStack_68;
    (pHVar4->heap).slot_array = MStack_60;
    CommonFields::set_capacity((CommonFields *)new_capacity_local,(size_t)set);
    sVar3 = new_capacity_local;
    paVar5 = alloc_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                        *)_auStack_28);
    std::allocator<char>::
    allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>
              (&local_6a,paVar5);
    bVar1 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                      ((HashSetResizeHelper *)local_50,sVar3,&local_6a,
                       (int)(char)resize_helper._29_1_,8,0x10);
    std::allocator<char>::~allocator(&local_6a);
    local_69 = bVar1;
    sVar3 = HashSetResizeHelper::old_capacity((HashSetResizeHelper *)local_50);
    if (sVar3 != 0) {
      if ((((resize_helper._31_1_ & 1) == 0) || ((resize_helper._30_1_ & 1) != 0)) &&
         (insert_slot.new_slots =
               (slot_type **)
               slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                           *)_auStack_28), (local_69 & 1) == 0)) {
        old_slots = (slot_type *)auStack_28;
        insert_slot.set =
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
              **)new_capacity_local;
        insert_slot.common = (CommonFields *)&insert_slot.new_slots;
        if ((resize_helper._31_1_ & 1) == 0) {
          total_probe_length =
               (size_t)HashSetResizeHelper::old_slots((HashSetResizeHelper *)local_50);
          i = 0;
          for (local_b8 = 0; sVar3 = local_b8,
              sVar6 = HashSetResizeHelper::old_capacity((HashSetResizeHelper *)local_50),
              sVar3 != sVar6; local_b8 = local_b8 + 1) {
            pcVar7 = HashSetResizeHelper::old_ctrl((HashSetResizeHelper *)local_50);
            bVar1 = IsFull(pcVar7[local_b8]);
            if (bVar1) {
              sVar3 = resize_impl::anon_class_24_3_14f42436::operator()
                                ((anon_class_24_3_14f42436 *)&old_slots,
                                 (slot_type *)(total_probe_length + local_b8 * 0x10));
              i = sVar3 + i;
            }
          }
          CommonFields::infoz((CommonFields *)new_capacity_local);
          HashtablezInfoHandle::RecordRehash(&local_b9,i);
          paVar5 = alloc_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                              *)_auStack_28);
          std::allocator<char>::
          allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>
                    (local_bb,paVar5);
          HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                    ((HashSetResizeHelper *)local_50,local_bb,0x10);
          std::allocator<char>::~allocator(local_bb);
        }
        else {
          buf = HashSetResizeHelper::old_soo_data((HashSetResizeHelper *)local_50);
          psVar2 = to_slot(buf);
          resize_impl::anon_class_24_3_14f42436::operator()
                    ((anon_class_24_3_14f42436 *)&old_slots,psVar2);
        }
      }
      return;
    }
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe93,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE static void resize_impl(
      CommonFields& common, size_t new_capacity,
      HashtablezInfoHandle forced_infoz) {
    raw_hash_set* set = reinterpret_cast<raw_hash_set*>(&common);
    ABSL_SWISSTABLE_ASSERT(IsValidCapacity(new_capacity));
    ABSL_SWISSTABLE_ASSERT(!set->fits_in_soo(new_capacity));
    const bool was_soo = set->is_soo();
    const bool had_soo_slot = was_soo && !set->empty();
    const ctrl_t soo_slot_h2 =
        had_soo_slot ? static_cast<ctrl_t>(H2(set->hash_of(set->soo_slot())))
                     : ctrl_t::kEmpty;
    HashSetResizeHelper resize_helper(common, was_soo, had_soo_slot,
                                      forced_infoz);
    // Initialize HashSetResizeHelper::old_heap_or_soo_. We can't do this in
    // HashSetResizeHelper constructor because it can't transfer slots when
    // transfer_uses_memcpy is false.
    // TODO(b/289225379): try to handle more of the SOO cases inside
    // InitializeSlots. See comment on cl/555990034 snapshot #63.
    if (PolicyTraits::transfer_uses_memcpy() || !had_soo_slot) {
      resize_helper.old_heap_or_soo() = common.heap_or_soo();
    } else {
      set->transfer(set->to_slot(resize_helper.old_soo_data()),
                    set->soo_slot());
    }
    common.set_capacity(new_capacity);
    // Note that `InitializeSlots` does different number initialization steps
    // depending on the values of `transfer_uses_memcpy` and capacities.
    // Refer to the comment in `InitializeSlots` for more details.
    const bool grow_single_group =
        resize_helper.InitializeSlots<CharAlloc, sizeof(slot_type),
                                      PolicyTraits::transfer_uses_memcpy(),
                                      SooEnabled(), alignof(slot_type)>(
            common, CharAlloc(set->alloc_ref()), soo_slot_h2, sizeof(key_type),
            sizeof(value_type));

    // In the SooEnabled() case, capacity is never 0 so we don't check.
    if (!SooEnabled() && resize_helper.old_capacity() == 0) {
      // InitializeSlots did all the work including infoz().RecordRehash().
      return;
    }
    ABSL_SWISSTABLE_ASSERT(resize_helper.old_capacity() > 0);
    // Nothing more to do in this case.
    if (was_soo && !had_soo_slot) return;

    slot_type* new_slots = set->slot_array();
    if (grow_single_group) {
      if (PolicyTraits::transfer_uses_memcpy()) {
        // InitializeSlots did all the work.
        return;
      }
      if (was_soo) {
        set->transfer(new_slots + resize_helper.SooSlotIndex(),
                      to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        // We want GrowSizeIntoSingleGroup to be called here in order to make
        // InitializeSlots not depend on PolicyTraits.
        resize_helper.GrowSizeIntoSingleGroup<PolicyTraits>(common,
                                                            set->alloc_ref());
      }
    } else {
      // InitializeSlots prepares control bytes to correspond to empty table.
      const auto insert_slot = [&](slot_type* slot) {
        size_t hash = PolicyTraits::apply(HashElement{set->hash_ref()},
                                          PolicyTraits::element(slot));
        auto target = find_first_non_full(common, hash);
        SetCtrl(common, target.offset, H2(hash), sizeof(slot_type));
        set->transfer(new_slots + target.offset, slot);
        return target.probe_length;
      };
      if (was_soo) {
        insert_slot(to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        auto* old_slots = static_cast<slot_type*>(resize_helper.old_slots());
        size_t total_probe_length = 0;
        for (size_t i = 0; i != resize_helper.old_capacity(); ++i) {
          if (IsFull(resize_helper.old_ctrl()[i])) {
            total_probe_length += insert_slot(old_slots + i);
          }
        }
        common.infoz().RecordRehash(total_probe_length);
      }
    }
    resize_helper.DeallocateOld<alignof(slot_type)>(CharAlloc(set->alloc_ref()),
                                                    sizeof(slot_type));
  }